

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall hwnet::util::TimerMgr::swap(TimerMgr *this,size_t idx1,size_t idx2)

{
  pointer ppTVar1;
  Timer *pTVar2;
  
  if (idx1 != idx2) {
    ppTVar1 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = ppTVar1[idx1 - 1];
    ppTVar1[idx1 - 1] = ppTVar1[idx2 - 1];
    (this->elements).super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[idx2 - 1] = pTVar2;
    ppTVar1 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar1[idx1 - 1]->mIndex = idx1;
    ppTVar1[idx2 - 1]->mIndex = idx2;
  }
  return;
}

Assistant:

void swap(size_t idx1, size_t idx2) {
		if(idx1 != idx2) {
			auto offset1 = getOffset(idx1);
			auto offset2 = getOffset(idx2);
			auto e = this->elements[offset1];
			this->elements[offset1] = this->elements[offset2];
			this->elements[offset2] = e;
			this->elements[offset1]->mIndex = idx1;
			this->elements[offset2]->mIndex = idx2;
		}
	}